

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result,FlatAllocator *alloc)

{
  char *pcVar1;
  void *pvVar2;
  long lVar3;
  size_t sVar4;
  Descriptor *parent_00;
  char *pcVar5;
  size_t sVar6;
  FileDescriptorTables *this_00;
  string *psVar7;
  pointer pcVar8;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  DescriptorBuilder *pDVar9;
  bool bVar10;
  bool bVar11;
  SymbolBase *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 *puVar12;
  long *plVar13;
  Symbol symbol;
  string_view name;
  string_view full_name_00;
  string_view element_name;
  string_view option_name;
  string_view name_00;
  string_view name_01;
  string_view full_name_01;
  string full_name;
  string outer_scope;
  Symbol local_150;
  EnumDescriptor *local_148;
  char *local_140;
  char *local_138;
  char local_130;
  undefined7 uStack_12f;
  char acStack_128 [8];
  DescriptorBuilder *local_120;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  *local_118;
  char *local_110;
  char *local_108;
  char local_100;
  undefined7 uStack_ff;
  Symbol *local_f0;
  char **local_e8;
  Symbol local_e0 [4];
  VoidPtr local_c0;
  code *pcStack_b8;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  local_140 = &local_130;
  local_138 = (char *)0x0;
  local_130 = '\0';
  local_150.ptr_ = (SymbolBase *)result;
  local_148 = parent;
  local_118 = (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
               *)alloc;
  std::__cxx11::string::reserve((ulong)&local_140);
  pcVar1 = (local_148->all_names_).payload_;
  std::__cxx11::string::append((char *)&local_140,(ulong)(pcVar1 + ~(ulong)*(ushort *)(pcVar1 + 2)))
  ;
  std::__cxx11::string::_M_append
            ((char *)&local_140,
             *(ulong *)((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
  ;
  pvVar2 = (proto->field_0)._impl_.name_.tagged_ptr_.ptr_;
  this_01 = protobuf::(anonymous_namespace)::
            FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
            ::AllocateArray<std::__cxx11::string>(local_118,2);
  plVar13 = (long *)((ulong)pvVar2 & 0xfffffffffffffffc);
  lVar3 = *plVar13;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_f0,lVar3,plVar13[1] + lVar3);
  local_120 = this;
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_f0);
  if (local_140 == &local_130) {
    local_b0.digits_[8] = acStack_128[0];
    local_b0.digits_[9] = acStack_128[1];
    local_b0.digits_[10] = acStack_128[2];
    local_b0.digits_[0xb] = acStack_128[3];
    local_b0.digits_[0xc] = acStack_128[4];
    local_b0.digits_[0xd] = acStack_128[5];
    local_b0.digits_[0xe] = acStack_128[6];
    local_b0.digits_[0xf] = acStack_128[7];
    local_b0.piece_._M_len = (size_t)local_b0.digits_;
  }
  else {
    local_b0.piece_._M_len = (size_t)local_140;
  }
  local_b0.digits_._1_7_ = uStack_12f;
  local_b0.digits_[0] = local_130;
  local_b0.piece_._M_str = local_138;
  local_138 = (char *)0x0;
  local_130 = '\0';
  local_140 = &local_130;
  std::__cxx11::string::operator=((string *)(this_01 + 1),(string *)&local_b0);
  if ((char *)local_b0.piece_._M_len != local_b0.digits_) {
    operator_delete((void *)local_b0.piece_._M_len,local_b0.digits_._0_8_ + 1);
  }
  pDVar9 = local_120;
  if (local_f0 != local_e0) {
    operator_delete(local_f0,(ulong)(local_e0[0].ptr_ + 1));
  }
  *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_150.ptr_ + 8) =
       this_01;
  *(int32_t *)(local_150.ptr_ + 4) = (proto->field_0)._impl_.number_;
  *(EnumDescriptor **)(local_150.ptr_ + 0x10) = local_148;
  puVar12 = (undefined8 *)
            ((ulong)(proto->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name._M_str = (char *)*puVar12;
  name._M_len = puVar12[1];
  full_name_01._M_str = this_01[1]._M_dataplus._M_p;
  full_name_01._M_len = this_01[1]._M_string_length;
  ValidateSymbolName(pDVar9,name,full_name_01,&proto->super_Message);
  option_name._M_str = "google.protobuf.EnumValueOptions";
  option_name._M_len = 0x20;
  AllocateOptions<google::protobuf::EnumValueDescriptor>
            (pDVar9,proto,(EnumValueDescriptor *)local_150.ptr_,3,option_name,
             (FlatAllocator *)local_118);
  puVar12 = *(undefined8 **)(local_150.ptr_ + 8);
  pcVar1 = (char *)puVar12[4];
  sVar4 = puVar12[5];
  parent_00 = local_148->containing_type_;
  pcVar5 = (char *)*puVar12;
  sVar6 = puVar12[1];
  (local_150.ptr_)->symbol_type_ = '\x05';
  full_name_00._M_str = pcVar1;
  full_name_00._M_len = sVar4;
  name_00._M_str = pcVar5;
  name_00._M_len = sVar6;
  bVar10 = AddSymbol(pDVar9,full_name_00,parent_00,name_00,&proto->super_Message,local_150);
  this_00 = pDVar9->file_tables_;
  pcVar1 = ((*(string **)(local_150.ptr_ + 8))->_M_dataplus)._M_p;
  sVar4 = (*(string **)(local_150.ptr_ + 8))->_M_string_length;
  symbol.ptr_ = local_150.ptr_ + 1;
  if ((EnumValueDescriptor *)local_150.ptr_ == (EnumValueDescriptor *)0x0) {
    symbol.ptr_ = (SymbolBase *)0x0;
  }
  (symbol.ptr_)->symbol_type_ = '\x06';
  name_01._M_str = pcVar1;
  name_01._M_len = sVar4;
  bVar11 = FileDescriptorTables::AddAliasUnderParent(this_00,local_148,name_01,symbol);
  pDVar9 = local_120;
  if (!bVar10 && bVar11) {
    local_108 = (char *)0x0;
    local_100 = '\0';
    local_110 = &local_100;
    if (local_148->containing_type_ == (Descriptor *)0x0) {
      psVar7 = local_120->file_->package_;
      pcVar8 = (psVar7->_M_dataplus)._M_p;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,pcVar8,pcVar8 + psVar7->_M_string_length);
    }
    else {
      pcVar1 = (local_148->containing_type_->all_names_).payload_;
      local_f0 = local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,pcVar1 + ~(ulong)*(ushort *)(pcVar1 + 2),pcVar1 + -1);
    }
    std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
    if (local_f0 != local_e0) {
      operator_delete(local_f0,(ulong)(local_e0[0].ptr_ + 1));
    }
    if (local_108 == (char *)0x0) {
      std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)0x0,0x13b5900);
    }
    else {
      local_f0 = (Symbol *)0x1;
      local_e8 = (char **)0x133b6af;
      local_b0.piece_._M_len = (size_t)local_108;
      local_b0.piece_._M_str = local_110;
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = "\"";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_80,(lts_20250127 *)&local_f0,&local_b0,&local_60,(AlphaNum *)0x133b6af);
      std::__cxx11::string::operator=((string *)&local_110,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    local_f0 = &local_150;
    local_e8 = &local_110;
    local_e0[0].ptr_ = (SymbolBase *)&local_148;
    pcStack_b8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    local_c0.obj = &local_f0;
    make_error.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::BuildEnumValue(google::protobuf::EnumValueDescriptorProto_const&,google::protobuf::EnumDescriptor_const*,google::protobuf::EnumValueDescriptor*,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
    ;
    make_error.ptr_.obj = local_c0.obj;
    element_name._M_str = (*(string **)(local_150.ptr_ + 8))[1]._M_dataplus._M_p;
    element_name._M_len = (*(string **)(local_150.ptr_ + 8))[1]._M_string_length;
    AddError(pDVar9,element_name,&proto->super_Message,NAME,make_error);
    if (local_110 != &local_100) {
      operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
    }
  }
  FileDescriptorTables::AddEnumValueByNumber
            (pDVar9->file_tables_,(EnumValueDescriptor *)local_150.ptr_);
  if (local_140 != &local_130) {
    operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result,
                                       internal::FlatAllocator& alloc) {
  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  std::string full_name;
  size_t scope_len = parent->full_name().size() - parent->name().size();
  full_name.reserve(scope_len + proto.name().size());
  full_name.append(parent->full_name().data(), scope_len);
  full_name.append(proto.name());

  result->all_names_ =
      alloc.AllocateStrings(proto.name(), std::move(full_name));
  result->number_ = proto.number();
  result->type_ = parent;

  ValidateSymbolName(proto.name(), result->full_name(), proto);

  // Copy options.
  AllocateOptions(proto, result, EnumValueDescriptorProto::kOptionsFieldNumber,
                  "google.protobuf.EnumValueOptions", alloc);

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
      AddSymbol(result->full_name(), parent->containing_type(), result->name(),
                proto, Symbol::EnumValue(result, 0));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope = file_tables_->AddAliasUnderParent(
      parent, result->name(), Symbol::EnumValue(result, 1));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    std::string outer_scope;
    if (parent->containing_type() == nullptr) {
      outer_scope = std::string(file_->package());
    } else {
      outer_scope = std::string(parent->containing_type()->full_name());
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = absl::StrCat("\"", outer_scope, "\"");
    }

    AddError(
        result->full_name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
          return absl::StrCat(
              "Note that enum values use C++ scoping rules, meaning that "
              "enum values are siblings of their type, not children of it.  "
              "Therefore, \"",
              result->name(), "\" must be unique within ", outer_scope,
              ", not just within \"", parent->name(), "\".");
        });
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}